

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O3

RealType __thiscall OpenMD::Thermo::getTaggedAtomPairDistance(Thermo *this)

{
  double *pdVar1;
  double dVar2;
  SimInfo *this_00;
  Globals *pGVar3;
  Snapshot *this_01;
  undefined8 uVar4;
  double dVar5;
  uint i;
  StuntDouble *pSVar6;
  StuntDouble *pSVar7;
  long lVar8;
  double tmp;
  Vector<double,_3U> result;
  double local_98 [4];
  double local_78 [4];
  double local_58 [4];
  Vector3d local_38;
  
  this_00 = this->info_;
  pGVar3 = this_00->simParams_;
  dVar5 = 0.0;
  if ((((pGVar3->TaggedAtomPair).super_ParameterBase.empty_ == false) &&
      (dVar5 = 0.0, (pGVar3->PrintTaggedPairDistance).super_ParameterBase.empty_ == false)) &&
     (dVar5 = 0.0, (pGVar3->PrintTaggedPairDistance).super_ParameterBase.field_0x2b == '\x01')) {
    this_01 = this_00->sman_->currentSnapshot_;
    uVar4 = *(undefined8 *)&(pGVar3->TaggedAtomPair).super_ParameterBase.field_0x2c;
    pSVar6 = SimInfo::getIOIndexToIntegrableObject(this_00,(int)uVar4);
    pSVar7 = SimInfo::getIOIndexToIntegrableObject(this->info_,(int)((ulong)uVar4 >> 0x20));
    lVar8 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_);
    pdVar1 = (double *)(lVar8 + (long)pSVar6->localIndex_ * 0x18);
    local_58[0] = *pdVar1;
    local_58[1] = pdVar1[1];
    local_58[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)pSVar6->localIndex_ * 0x18);
    lVar8 = *(long *)((long)&(pSVar7->snapshotMan_->currentSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + pSVar7->storage_);
    local_78[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)pSVar7->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar8 + (long)pSVar7->localIndex_ * 0x18);
    local_78[0] = *pdVar1;
    local_78[1] = pdVar1[1];
    local_98[0] = 0.0;
    local_98[1] = 0.0;
    local_98[2] = 0.0;
    lVar8 = 0;
    do {
      local_98[lVar8] = local_78[lVar8] - local_58[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    local_38.super_Vector<double,_3U>.data_[2] = local_98[2];
    local_38.super_Vector<double,_3U>.data_[0] = local_98[0];
    local_38.super_Vector<double,_3U>.data_[1] = local_98[1];
    Snapshot::wrapVector(this_01,&local_38);
    dVar5 = 0.0;
    lVar8 = 0;
    do {
      dVar2 = local_38.super_Vector<double,_3U>.data_[lVar8];
      dVar5 = dVar5 + dVar2 * dVar2;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
  }
  return dVar5;
}

Assistant:

RealType Thermo::getTaggedAtomPairDistance() {
    Snapshot* currSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    Globals* simParams     = info_->getSimParams();

    if (simParams->haveTaggedAtomPair() &&
        simParams->havePrintTaggedPairDistance()) {
      if (simParams->getPrintTaggedPairDistance()) {
        pair<int, int> tap = simParams->getTaggedAtomPair();
        Vector3d pos1, pos2, rab;

#ifdef IS_MPI
        int mol1 = info_->getGlobalMolMembership(tap.first);
        int mol2 = info_->getGlobalMolMembership(tap.second);

        int proc1 = info_->getMolToProc(mol1);
        int proc2 = info_->getMolToProc(mol2);

        RealType data[3];
        if (proc1 == worldRank) {
          StuntDouble* sd1 = info_->getIOIndexToIntegrableObject(tap.first);
          pos1             = sd1->getPos();
          data[0]          = pos1.x();
          data[1]          = pos1.y();
          data[2]          = pos1.z();
          MPI_Bcast(data, 3, MPI_REALTYPE, proc1, MPI_COMM_WORLD);
        } else {
          MPI_Bcast(data, 3, MPI_REALTYPE, proc1, MPI_COMM_WORLD);
          pos1 = Vector3d(data);
        }

        if (proc2 == worldRank) {
          StuntDouble* sd2 = info_->getIOIndexToIntegrableObject(tap.second);
          pos2             = sd2->getPos();
          data[0]          = pos2.x();
          data[1]          = pos2.y();
          data[2]          = pos2.z();
          MPI_Bcast(data, 3, MPI_REALTYPE, proc2, MPI_COMM_WORLD);
        } else {
          MPI_Bcast(data, 3, MPI_REALTYPE, proc2, MPI_COMM_WORLD);
          pos2 = Vector3d(data);
        }
#else
        StuntDouble* at1 = info_->getIOIndexToIntegrableObject(tap.first);
        StuntDouble* at2 = info_->getIOIndexToIntegrableObject(tap.second);
        pos1             = at1->getPos();
        pos2             = at2->getPos();
#endif
        rab = pos2 - pos1;
        currSnapshot->wrapVector(rab);
        return rab.length();
      }
      return 0.0;
    }
    return 0.0;
  }